

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testPipelineQueryActive
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  GLuint pipeline;
  Pipeline *pPVar1;
  deUint32 dVar2;
  undefined8 uVar3;
  deUint32 program;
  GLenum GVar4;
  ProgramWrapper *pPVar5;
  GLint queryActive;
  ProgramParams pipePp;
  deUint32 local_1d4;
  Pipeline *local_1d0;
  ResultCollector *local_1c8;
  undefined1 local_1c0 [16];
  Pipeline local_1b0;
  ios_base local_148 [264];
  ProgramParams local_40;
  
  local_40 = genProgramParams(&this->m_rnd);
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)local_1c0,this,&local_40);
  uVar3 = local_1c0._0_8_;
  local_1c0._0_8_ = (Pipeline *)0x0;
  if ((pipeOut->
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
      ).m_data.ptr != (Pipeline *)uVar3) {
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
    ::reset(&pipeOut->
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           );
    (pipeOut->
    super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
    ).m_data.ptr = (Pipeline *)uVar3;
  }
  pPVar1 = (pipeOut->
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           ).m_data.ptr;
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::reset((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           *)local_1c0);
  pPVar5 = (pPVar1->vtxProg).
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  pipeline = *(GLuint *)
              ((long)(pPVar1->pipeline).
                     super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                     .m_data.ptr + 8);
  if (pPVar5 == (ProgramWrapper *)0x0) {
    pPVar5 = (pPVar1->fullProg).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
  }
  program = (*pPVar5->_vptr_ProgramWrapper[2])();
  local_1d4 = 0;
  this_00 = &this->super_CallLogWrapper;
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glGetProgramPipelineiv(this_00,pipeline,0x8259,(GLint *)&local_1d4);
  GVar4 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar4,"glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x5ca);
  dVar2 = local_1d4;
  (this->super_CallLogWrapper).m_enableLog = false;
  local_1c0._0_8_ = &local_1b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,"Program pipeline query reported non-zero initial active program",
             "");
  local_1c8 = &this->m_status;
  tcu::ResultCollector::check(local_1c8,dVar2 == 0,(string *)local_1c0);
  if ((Pipeline *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,
                    (ulong)((long)local_1b0.pipeline.
                                  super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                                  .m_data.ptr + 1));
  }
  local_1d0 = pPVar1;
  glu::ProgramPipeline::activeShaderProgram
            ((pPVar1->pipeline).
             super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
             m_data.ptr,program);
  local_1c0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_01 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Set pipeline ",0xd);
  std::ostream::_M_insert<unsigned_long>((ulong)this_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,"\'s active shader program to ",0x1c);
  std::ostream::_M_insert<unsigned_long>((ulong)this_01);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_01);
  std::ios_base::~ios_base(local_148);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glGetProgramPipelineiv(this_00,pipeline,0x8259,(GLint *)&local_1d4);
  GVar4 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar4,"glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x5d3);
  dVar2 = local_1d4;
  (this->super_CallLogWrapper).m_enableLog = false;
  local_1c0._0_8_ = &local_1b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,"Program pipeline query reported incorrect active program","");
  tcu::ResultCollector::check(local_1c8,dVar2 == program,(string *)local_1c0);
  pPVar1 = local_1d0;
  if ((Pipeline *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,
                    (ulong)((long)local_1b0.pipeline.
                                  super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                                  .m_data.ptr + 1));
  }
  glu::ProgramPipeline::activeShaderProgram
            ((pPVar1->pipeline).
             super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
             m_data.ptr,0);
  return;
}

Assistant:

void SeparateShaderTest::testPipelineQueryActive (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pipePp		= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pipePp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	GLuint						newActive	= pipeline.getVertexProgram().getProgramName();
	GLint						queryActive	= 0;

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)));
	m_status.check(queryActive == 0,
				   "Program pipeline query reported non-zero initial active program");

	pipeline.pipeline->activeShaderProgram(newActive);
	log() << TestLog::Message
		  << "Set pipeline " << pipeName << "'s active shader program to " << newActive
		  << TestLog::EndMessage;

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)));
	m_status.check(GLuint(queryActive) == newActive,
				   "Program pipeline query reported incorrect active program");

	pipeline.pipeline->activeShaderProgram(0);
}